

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forest_device.cpp
# Opt level: O0

void embree::update_instance_transforms(void)

{
  uint i;
  undefined4 local_4;
  
  if (g_use_instance_array) {
    rtcUpdateGeometryBuffer(instance_array,0x17,0);
    rtcCommitGeometry(instance_array);
  }
  else {
    for (local_4 = 0; local_4 < num_trees; local_4 = local_4 + 1) {
      rtcSetGeometryTransform
                (*(undefined8 *)(instances + (ulong)local_4 * 8),0,0x9244,
                 DAT_00620590 + (ulong)local_4 * 0x40);
      rtcCommitGeometry(*(undefined8 *)(instances + (ulong)local_4 * 8));
    }
  }
  return;
}

Assistant:

void update_instance_transforms()
{
  if (g_use_instance_array)
  {
    rtcUpdateGeometryBuffer(instance_array, RTC_BUFFER_TYPE_TRANSFORM, 0);
    rtcCommitGeometry(instance_array);
  }
  else
  {
    for (unsigned int i = 0; i < num_trees; ++i) {
      rtcSetGeometryTransform(instances[i],0,RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR,(float*)&data.tree_transforms_host[i]);
      rtcCommitGeometry(instances[i]);
    }
  }
}